

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Time.cpp
# Opt level: O2

String * __thiscall Time::toString(String *__return_storage_ptr__,Time *this,char *format)

{
  undefined4 uVar1;
  undefined4 uVar2;
  char *__s;
  size_t sVar3;
  usize size;
  tm local_58;
  
  if (*format == '\0') {
    __return_storage_ptr__->data = &String::emptyData.super_Data;
  }
  else {
    local_58.tm_sec = this->sec;
    local_58.tm_min = this->min;
    local_58.tm_hour = this->hour;
    local_58.tm_mday = this->day;
    uVar1 = this->month;
    uVar2 = this->year;
    local_58.tm_mon = uVar1 + -1;
    local_58.tm_year = uVar2 + -0x76c;
    local_58.tm_wday = this->wday;
    local_58.tm_yday = this->yday;
    local_58.tm_isdst = (int)this->dst;
    String::String(__return_storage_ptr__,0x100);
    while( true ) {
      __s = String::operator_cast_to_char_(__return_storage_ptr__);
      if (__return_storage_ptr__->data->ref == 1) {
        sVar3 = __return_storage_ptr__->data->capacity;
      }
      else {
        sVar3 = 0;
      }
      sVar3 = strftime(__s,sVar3,format,&local_58);
      if (sVar3 != 0) break;
      if (__return_storage_ptr__->data->ref == 1) {
        size = __return_storage_ptr__->data->capacity * 2;
      }
      else {
        size = 0;
      }
      String::reserve(__return_storage_ptr__,size);
    }
    String::resize(__return_storage_ptr__,sVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

String Time::toString(const char* format)
{
  if(!*format)
    return String();
  tm tm;
  tm.tm_sec = sec;
  tm.tm_min = min;
  tm.tm_hour = hour;
  tm.tm_mday = day;
  tm.tm_mon = month - 1;
  tm.tm_year = year - 1900;
  tm.tm_wday = wday;
  tm.tm_yday = yday;
  tm.tm_isdst = dst;

  String result(256);
  char* buffer;
  usize len;
  for(;;)
  {
    buffer = result;
    len = strftime(buffer, result.capacity(), format, &tm);
    if(len > 0)
      break;
    result.reserve(result.capacity() * 2);
  }
  result.resize(len);
  return result;
}